

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_readwrite(connectdata *conn,Curl_easy *data,_Bool *done,_Bool *comeback)

{
  _Bool *p_Var1;
  int *piVar2;
  long *plVar3;
  char **ppcVar4;
  char cVar5;
  _func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *p_Var6;
  void *pvVar7;
  curl_off_t *pcVar8;
  curl_off_t cVar9;
  _Bool _Var10;
  CURLcode CVar11;
  CURLcode CVar12;
  CHUNKcode code;
  CURLcode CVar13;
  int iVar14;
  long lVar15;
  size_t sVar16;
  char *pcVar17;
  _Bool *p_Var18;
  time_t tVar19;
  size_t sVar20;
  ssize_t sVar21;
  ssize_t *wrotep;
  Curl_handler *pCVar22;
  _Bool *p_Var23;
  ulong uVar24;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong uVar25;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  _Bool *p_Var26;
  uint uVar27;
  long lVar28;
  long lVar29;
  curl_socket_t readfd0;
  uint uVar30;
  int iVar31;
  bool bVar32;
  timeval tVar33;
  _Bool readmore;
  ssize_t bytes_written;
  CURLcode local_68;
  _Bool local_61;
  ulong local_60;
  uint local_54;
  _Bool *local_50;
  uint local_44;
  long local_40;
  _Bool *local_38;
  
  uVar27 = conn->cselect_bits;
  conn->cselect_bits = 0;
  uVar30 = (data->req).keepon;
  uVar24 = 0xffffffff;
  readfd0 = -1;
  if ((uVar30 & 0x15) == 1) {
    readfd0 = conn->sockfd;
  }
  if ((uVar30 & 0x2a) == 2) {
    uVar24 = (ulong)(uint)conn->writesockfd;
  }
  bVar32 = (conn->data->state).drain != 0;
  CVar11 = (CURLcode)bVar32;
  uVar27 = uVar27 | bVar32;
  if (uVar27 == 0) {
    CVar11 = CURLE_OK;
    uVar27 = Curl_socket_check(readfd0,-1,(curl_socket_t)uVar24,0);
    uVar24 = extraout_RDX;
  }
  if (uVar27 == 4) {
    Curl_failf(data,"select/poll returned error");
    comeback = (_Bool *)0x37;
    goto LAB_00508b61;
  }
  uVar30 = 0;
  if ((((data->req).keepon & 1) != 0) &&
     (((uVar27 & 1) != 0 || (uVar30 = 0, (conn->bits).stream_was_rewound == true)))) {
    readmore = false;
    *done = false;
    *comeback = false;
    iVar14 = 100;
    local_60 = local_60 & 0xffffffff00000000;
    local_40 = 0;
    CVar13 = CURLE_OK;
    local_50 = done;
    local_44 = uVar27;
    local_38 = comeback;
    do {
      sVar20 = (data->set).buffer_size;
      lVar15 = (data->req).size;
      if (((lVar15 != -1) && ((data->req).header == false)) &&
         (sVar16 = lVar15 - (data->req).bytecount, (long)sVar16 < (long)sVar20)) {
        sVar20 = sVar16;
      }
      if (sVar20 == 0) {
        bytes_written = 0;
LAB_00507e44:
        if ((((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) &&
           (Curl_pgrsTime(data,TIMER_STARTTRANSFER), uVar24 = extraout_RDX_01,
           (data->req).exp100 != EXP100_SEND_DATA)) {
          tVar33 = curlx_tvnow();
          uVar24 = tVar33.tv_usec;
          (data->req).start100 = tVar33;
        }
        if (bytes_written == 0) {
          uVar24 = CONCAT71((int7)(uVar24 >> 8),(data->req).bodywrites == 0);
        }
        else {
          uVar24 = 0;
        }
        CVar11 = (CURLcode)CONCAT71((int7)(sVar20 >> 8),0 < bytes_written | (byte)uVar24);
        if (0 < bytes_written || (uVar24 & 1) != 0) {
          p_Var18 = (_Bool *)(data->req).buf;
          p_Var18[bytes_written] = false;
          (data->req).str = (data->req).buf;
          p_Var6 = conn->handler->readwrite;
          if (p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) {
            uVar24 = uVar24 & 0xffffffff;
            p_Var18 = &readmore;
            CVar13 = (*p_Var6)(data,conn,&bytes_written,p_Var18);
            CVar11 = (CURLcode)p_Var18;
            local_60 = CONCAT44(local_60._4_4_,1);
            uVar25 = extraout_RDX_02;
            if (CVar13 != CURLE_OK) goto LAB_00507ef7;
            CVar13 = CURLE_OK;
            iVar31 = 2;
            if (readmore != false) goto LAB_00507f19;
          }
          CVar11 = (CURLcode)p_Var18;
          if ((data->req).header == true) {
            local_54 = (uint)uVar24;
            local_61 = false;
            p_Var18 = &local_61;
            CVar12 = Curl_http_readwrite_headers(data,conn,&bytes_written,p_Var18);
            CVar11 = (CURLcode)p_Var18;
            local_60 = CONCAT44(local_60._4_4_,1);
            if (CVar12 == CURLE_OK) {
              p_Var6 = conn->handler->readwrite;
              uVar24 = (ulong)local_54;
              if (((p_Var6 == (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)
                              0x0) || (0 < (data->req).maxdownload)) || (bytes_written < 1)) {
LAB_005080f4:
                if (local_61 == true) {
                  iVar31 = 2;
                  if (0 < bytes_written) {
                    _Var10 = Curl_pipeline_wanted(conn->data->multi,1);
                    CVar11 = (CURLcode)(data->state).path;
                    if (_Var10) {
                      Curl_infof(data,
                                 "Rewinding stream by : %zd bytes on url %s (zero-length body)\n",
                                 bytes_written);
                      conn->read_pos = conn->read_pos - bytes_written;
                      (conn->bits).stream_was_rewound = true;
                    }
                    else {
                      Curl_infof(data,
                                 "Excess found in a non pipelined read: excess = %zd url = %s (zero-length body)\n"
                                 ,bytes_written);
                    }
                    CVar13 = CURLE_OK;
                    goto LAB_00507fa8;
                  }
                  bVar32 = false;
                }
                else {
                  iVar31 = 0;
                  bVar32 = true;
                }
                CVar13 = CURLE_OK;
              }
              else {
                p_Var18 = &readmore;
                CVar12 = (*p_Var6)(data,conn,&bytes_written,p_Var18);
                CVar11 = (CURLcode)p_Var18;
                CVar13 = CURLE_OK;
                if (CVar12 != CURLE_OK) goto LAB_00507fa4;
                uVar24 = (ulong)local_54;
                if (readmore == false) goto LAB_005080f4;
                iVar31 = 2;
                bVar32 = false;
              }
            }
            else {
LAB_00507fa4:
              CVar13 = CVar12;
              iVar31 = 1;
              local_68 = CVar13;
LAB_00507fa8:
              bVar32 = false;
              uVar24 = (ulong)local_54;
            }
            if (!bVar32) goto LAB_00507f19;
          }
          if ((((data->req).str != (char *)0x0) && ((data->req).header == false)) &&
             (0 < bytes_written || (uVar24 & 1) != 0)) {
            if ((data->set).opt_no_body == true) {
              Curl_conncontrol(conn,2);
              *local_50 = true;
              local_68 = CURLE_WEIRD_SERVER_REPLY;
              uVar24 = extraout_RDX_04;
LAB_0050800d:
              local_60 = CONCAT44(local_60._4_4_,1);
LAB_00508015:
              iVar31 = 1;
              goto LAB_00507f19;
            }
            if (((data->req).bodywrites == 0 && (uVar24 & 1) == 0) &&
               ((conn->handler->protocol & 0x40003) != 0)) {
              if ((data->req).newurl != (char *)0x0) {
                if ((conn->bits).close == true) {
                  piVar2 = &(data->req).keepon;
                  *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                  *local_50 = true;
                  local_68 = CURLE_OK;
                  goto LAB_0050800d;
                }
                (data->req).ignorebody = true;
                uVar24 = uVar24 & 0xffffffff;
                Curl_infof(data,"Ignoring the response-body\n");
              }
              lVar15 = (data->state).resume_from;
              if (((lVar15 != 0) && ((data->req).content_range == false)) &&
                 (((data->set).httpreq == HTTPREQ_GET && ((data->req).ignorebody == false)))) {
                if ((data->req).size != lVar15) {
                  Curl_failf(data,"HTTP server doesn\'t seem to support byte ranges. Cannot resume."
                            );
                  local_68 = CURLE_RANGE_ERROR;
                  uVar24 = extraout_RDX_09;
                  goto LAB_0050800d;
                }
                local_68 = CURLE_OK;
                Curl_infof(data,"The entire document is already downloaded");
                local_60 = CONCAT44(local_60._4_4_,1);
                Curl_conncontrol(conn,1);
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                *local_50 = true;
                uVar24 = extraout_RDX_08;
                goto LAB_00508015;
              }
              if (((data->set).timecondition != CURL_TIMECOND_NONE) &&
                 ((data->state).range == (char *)0x0)) {
                uVar24 = uVar24 & 0xffffffff;
                _Var10 = Curl_meets_timecondition(data,(data->req).timeofdoc);
                if (!_Var10) {
                  *local_50 = true;
                  (data->info).httpcode = 0x130;
                  local_68 = CURLE_OK;
                  Curl_infof(data,"Simulate a HTTP 304 response!\n");
                  local_60 = CONCAT44(local_60._4_4_,1);
                  Curl_conncontrol(conn,1);
                  uVar24 = extraout_RDX_07;
                  goto LAB_00508015;
                }
              }
            }
            plVar3 = &(data->req).bodywrites;
            *plVar3 = *plVar3 + 1;
            uVar25 = uVar24;
            if ((data->set).verbose == true) {
              uVar25 = uVar24 & 0xffffffff;
              if ((data->req).badheader != HEADER_NORMAL) {
                sVar20 = (data->req).hbuflen;
                Curl_debug(data,CURLINFO_DATA_IN,(data->state).headerbuff,sVar20,conn);
                CVar11 = (CURLcode)sVar20;
                if ((data->req).badheader != HEADER_PARTHEADER) goto LAB_00508258;
              }
              sVar21 = bytes_written;
              Curl_debug(data,CURLINFO_DATA_IN,(data->req).str,bytes_written,conn);
              CVar11 = (CURLcode)sVar21;
            }
LAB_00508258:
            if ((data->req).chunk == true) {
              uVar24 = uVar25 & 0xffffffff;
              wrotep = &bytes_written;
              code = Curl_httpchunk_read(conn,(data->req).str,bytes_written,wrotep);
              CVar11 = (CURLcode)wrotep;
              if (code < CHUNKE_TOO_LONG_HEX) {
                if (code == CHUNKE_STOP) {
                  piVar2 = &(data->req).keepon;
                  *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                  sVar20 = (conn->chunk).dataleft;
                  if (sVar20 != 0) {
                    local_60 = sVar20;
                    Curl_infof(conn->data,"Leftovers after chunking: %zu bytes\n");
                    _Var10 = Curl_pipeline_wanted(conn->data->multi,1);
                    if (_Var10) {
                      Curl_infof(conn->data,"Rewinding %zu bytes\n",local_60);
                      conn->read_pos = conn->read_pos - local_60;
                      (conn->bits).stream_was_rewound = true;
                    }
                  }
                }
              }
              else if (code == CHUNKE_WRITE_ERROR) {
                Curl_failf(data,"Failed writing data");
                local_68 = CURLE_WRITE_ERROR;
              }
              else {
                pcVar17 = Curl_chunked_strerror(code);
                Curl_failf(data,"%s in chunked-encoding",pcVar17);
                local_68 = CURLE_RECV_ERROR;
              }
              local_60 = CONCAT44(local_60._4_4_,1);
              if (CHUNKE_OK < code) goto LAB_00508015;
            }
            if (((data->req).badheader != HEADER_NORMAL) && ((data->req).ignorebody == false)) {
              pcVar8 = &(data->req).bytecount;
              *pcVar8 = *pcVar8 + (data->req).hbuflen;
            }
            lVar15 = (data->req).maxdownload;
            uVar24 = uVar25 & 0xffffffff;
            if (lVar15 != -1) {
              lVar28 = bytes_written + (data->req).bytecount;
              lVar29 = lVar28 - lVar15;
              if (lVar15 <= lVar28) {
                if ((lVar29 != 0) && ((data->req).ignorebody == false)) {
                  _Var10 = Curl_pipeline_wanted(conn->data->multi,1);
                  if (_Var10) {
                    Curl_infof(data,
                               "Rewinding stream by : %zu bytes on url %s (size = %ld, maxdownload = %ld, bytecount = %ld, nread = %zd)\n"
                               ,lVar29,(data->state).path,(data->req).size,(data->req).maxdownload,
                               (data->req).bytecount,bytes_written);
                    conn->read_pos = conn->read_pos - lVar29;
                    (conn->bits).stream_was_rewound = true;
                  }
                  else {
                    Curl_infof(data,
                               "Excess found in a non pipelined read: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld\n"
                               ,lVar29,(data->req).size,(data->req).maxdownload,
                               (data->req).bytecount);
                  }
                }
                bytes_written = (data->req).maxdownload - (data->req).bytecount;
                CVar11 = CURLE_OK;
                if (bytes_written < 1) {
                  bytes_written = 0;
                }
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                local_40 = lVar29;
              }
            }
            lVar15 = (data->req).bytecount + bytes_written;
            (data->req).bytecount = lVar15;
            Curl_pgrsSetDownloadCounter(data,lVar15);
            if (((data->req).chunk == false) &&
               ((bytes_written != 0 || ((data->req).badheader != HEADER_NORMAL || (uVar25 & 1) != 0)
                ))) {
              if (((data->req).badheader != HEADER_NORMAL) && ((data->req).ignorebody == false)) {
                sVar20 = (data->req).maxdownload;
                if ((sVar20 == 0xffffffffffffffff) || ((long)(data->req).hbuflen <= (long)sVar20)) {
                  pcVar17 = (data->state).headerbuff;
                  sVar20 = (data->req).hbuflen;
                }
                else {
                  pcVar17 = (data->state).headerbuff;
                }
                CVar13 = Curl_client_write(conn,1,pcVar17,sVar20);
                CVar11 = (CURLcode)sVar20;
                local_60 = CONCAT44(local_60._4_4_,1);
                uVar25 = extraout_RDX_06;
                if (CVar13 != CURLE_OK) goto LAB_00507ef7;
                CVar13 = CURLE_OK;
              }
              if (((data->req).badheader < HEADER_ALLBAD) && ((data->req).ignorebody == false)) {
                sVar21 = bytes_written;
                CVar13 = Curl_client_write(conn,1,(data->req).str,bytes_written);
                CVar11 = (CURLcode)sVar21;
              }
              (data->req).badheader = HEADER_NORMAL;
              local_60 = CONCAT44(local_60._4_4_,1);
              uVar25 = uVar24;
              if (CVar13 != CURLE_OK) goto LAB_00507ef7;
              CVar13 = CURLE_OK;
            }
          }
          p_Var6 = conn->handler->readwrite;
          if (((p_Var6 == (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0)
              || (local_40 == 0)) || ((conn->bits).stream_was_rewound != false)) {
            iVar31 = 0;
            local_60 = CONCAT44(local_60._4_4_,1);
            if ((char)uVar24 != '\0') {
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            }
          }
          else {
            ppcVar4 = &(data->req).str;
            *ppcVar4 = *ppcVar4 + bytes_written;
            bytes_written = local_40;
            p_Var18 = &readmore;
            CVar13 = (*p_Var6)(data,conn,&bytes_written,p_Var18);
            CVar11 = (CURLcode)p_Var18;
            local_60 = CONCAT44(local_60._4_4_,1);
            uVar25 = extraout_RDX_05;
            if (CVar13 != CURLE_OK) goto LAB_00507ef7;
            iVar31 = 2;
            uVar24 = extraout_RDX_05;
            CVar13 = CURLE_OK;
            if (readmore == true) {
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 | 1;
              CVar13 = CURLE_OK;
            }
          }
        }
        else {
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
          iVar31 = 2;
          local_60 = CONCAT44(local_60._4_4_,1);
        }
      }
      else {
        CVar13 = Curl_read(conn,conn->sockfd,(data->req).buf,sVar20,&bytes_written);
        CVar11 = (CURLcode)sVar20;
        uVar24 = extraout_RDX_00;
        if (CVar13 == CURLE_OK) goto LAB_00507e44;
        iVar31 = 2;
        uVar25 = extraout_RDX_00;
        uVar24 = extraout_RDX_00;
        if (CVar13 == CURLE_AGAIN) goto LAB_00507f19;
LAB_00507ef7:
        iVar31 = 1;
        uVar24 = uVar25;
        local_68 = CVar13;
      }
LAB_00507f19:
      if (iVar31 != 0) {
        if (iVar31 == 2) goto LAB_005086ff;
        comeback = (_Bool *)(ulong)local_68;
        done = local_50;
        uVar30 = (uint)local_60;
        uVar27 = local_44;
        goto LAB_0050875b;
      }
      if (((conn->handler->protocol & 0x30) == 0) &&
         (_Var10 = Curl_ssl_data_pending(conn,0), uVar24 = extraout_RDX_03, !_Var10))
      goto LAB_005086ff;
      bVar32 = iVar14 != 0;
      iVar14 = iVar14 + -1;
    } while (bVar32);
    iVar14 = -1;
LAB_005086ff:
    uVar27 = local_44;
    done = local_50;
    if (iVar14 < 1) {
      conn->cselect_bits = 1;
      *local_38 = true;
    }
    comeback = (_Bool *)0x0;
    uVar30 = (uint)local_60;
    if ((((data->req).keepon & 3U) == 2) && ((conn->bits).close == true)) {
      comeback = (_Bool *)0x0;
      Curl_infof(data,"we are done reading and this is set to close, stop send\n");
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
    }
LAB_0050875b:
    if (((int)comeback != 0) || (*done != false)) goto LAB_00508b61;
  }
  if ((uVar27 & (data->req).keepon & 2) != 0) {
    if (((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) {
      Curl_pgrsTime(data,TIMER_STARTTRANSFER);
    }
    uVar27 = uVar30 | 2;
    if ((data->req).upload_present == 0) {
      (data->req).upload_fromhere = (data->state).uploadbuffer;
      if ((data->req).upload_done == false) {
        pvVar7 = (data->req).protop;
        if (((data->req).exp100 == EXP100_SENDING_REQUEST) && (*(int *)((long)pvVar7 + 0x78) == 2))
        {
          (data->req).exp100 = EXP100_AWAITING_CONTINUE;
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
          tVar33 = curlx_tvnow();
          (data->req).start100 = tVar33;
          uVar27 = uVar30 & 0xfffffffd;
          bVar32 = false;
          Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
          iVar14 = 2;
        }
        else {
          pCVar22 = conn->handler;
          if ((pCVar22->protocol & 0x40003) == 0) {
            bVar32 = false;
          }
          else {
            bVar32 = *(int *)((long)pvVar7 + 0x78) == 1;
          }
          CVar13 = Curl_fillreadbuffer(conn,0x4000,(int *)&bytes_written);
          CVar11 = (CURLcode)pCVar22;
          if (CVar13 == CURLE_OK) {
            comeback = (_Bool *)(long)(int)bytes_written;
            iVar14 = 0;
          }
          else {
            iVar14 = 1;
            CVar11 = CVar13;
          }
        }
        if (iVar14 != 2) {
          uVar30 = uVar27;
          if (iVar14 == 0) goto LAB_00508848;
          goto LAB_00508972;
        }
      }
      else {
        comeback = (_Bool *)0x0;
        bVar32 = false;
LAB_00508848:
        if ((comeback != (_Bool *)0x0) || (((data->req).keepon & 0x20) == 0)) {
          uVar30 = uVar27;
          if (0 < (long)comeback) {
            (data->req).upload_present = (ssize_t)comeback;
            if ((!bVar32) && (((data->set).prefer_ascii != false || ((data->set).crlf == true)))) {
              if ((data->state).scratch == (char *)0x0) {
                pcVar17 = (char *)(*Curl_cmalloc)((data->set).buffer_size * 2);
                (data->state).scratch = pcVar17;
                if (pcVar17 == (char *)0x0) {
                  Curl_failf(data,"Failed to alloc scratch buffer!");
                  CVar11 = CURLE_OUT_OF_MEMORY;
                  goto LAB_00508972;
                }
              }
              p_Var18 = (_Bool *)0x1;
              if (1 < (long)comeback) {
                p_Var18 = comeback;
              }
              p_Var23 = (_Bool *)0x0;
              p_Var26 = (_Bool *)0x0;
              do {
                cVar5 = (data->req).upload_fromhere[(long)p_Var23];
                pcVar17 = (data->state).scratch;
                if (cVar5 == '\n') {
                  p_Var1 = p_Var26 + 1;
                  pcVar17[(long)p_Var26] = '\r';
                  ((data->state).scratch + 1)[(long)p_Var26] = '\n';
                  p_Var26 = p_Var1;
                  if (((data->set).crlf == false) &&
                     (lVar15 = (data->state).infilesize, lVar15 != -1)) {
                    (data->state).infilesize = lVar15 + 1;
                  }
                }
                else {
                  pcVar17[(long)p_Var26] = cVar5;
                }
                p_Var23 = p_Var23 + 1;
                p_Var26 = p_Var26 + 1;
              } while (p_Var18 != p_Var23);
              if (p_Var26 != comeback) {
                (data->req).upload_fromhere = (data->state).scratch;
                (data->req).upload_present = (ssize_t)p_Var26;
              }
            }
            goto LAB_00507c9e;
          }
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
          if (((conn->bits).rewindaftersend != true) ||
             (CVar11 = Curl_readrewind(conn), CVar11 == CURLE_OK)) {
            CVar11 = CURLE_OK;
          }
          if (CVar11 != CURLE_OK) goto LAB_00508972;
        }
      }
LAB_00508970:
      CVar11 = CURLE_OK;
      uVar30 = uVar27;
    }
    else {
LAB_00507c9e:
      CVar11 = Curl_write(conn,conn->writesockfd,(data->req).upload_fromhere,
                          (data->req).upload_present,&bytes_written);
      uVar30 = uVar27;
      if (CVar11 == CURLE_OK) {
        if ((data->set).verbose == true) {
          Curl_debug(data,CURLINFO_DATA_OUT,(data->req).upload_fromhere,bytes_written,conn);
        }
        lVar15 = (data->req).writebytecount + bytes_written;
        (data->req).writebytecount = lVar15;
        if (lVar15 == (data->state).infilesize) {
          (data->req).upload_done = true;
          Curl_infof(data,"We are completely uploaded and fine\n");
        }
        lVar15 = (data->req).upload_present - bytes_written;
        if (lVar15 == 0) {
          (data->req).upload_fromhere = (data->state).uploadbuffer;
          (data->req).upload_present = 0;
          if ((data->req).upload_done == true) {
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
            if (((conn->bits).rewindaftersend != true) ||
               (CVar11 = Curl_readrewind(conn), CVar11 == CURLE_OK)) {
              CVar11 = CURLE_OK;
            }
            if (CVar11 != CURLE_OK) goto LAB_00508972;
          }
        }
        else {
          (data->req).upload_present = lVar15;
          ppcVar4 = &(data->req).upload_fromhere;
          *ppcVar4 = *ppcVar4 + bytes_written;
        }
        Curl_pgrsSetUploadCounter(data,(data->req).writebytecount);
        goto LAB_00508970;
      }
    }
LAB_00508972:
    comeback = (_Bool *)(ulong)CVar11;
    if (CVar11 != CURLE_OK) goto LAB_00508b61;
  }
  tVar33 = curlx_tvnow();
  (data->req).now = tVar33;
  if (uVar30 == 0) {
    if (((data->req).exp100 == EXP100_AWAITING_CONTINUE) &&
       (tVar19 = curlx_tvdiff(tVar33,(data->req).start100), (data->set).expect_100_timeout <= tVar19
       )) {
      (data->req).exp100 = EXP100_SEND_DATA;
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 | 2;
      Curl_expire_done(data,EXPIRE_100_TIMEOUT);
      Curl_infof(data,"Done waiting for 100-continue\n");
    }
  }
  else {
    pcVar8 = (data->req).bytecountp;
    if (pcVar8 != (curl_off_t *)0x0) {
      *pcVar8 = (data->req).bytecount;
    }
    pcVar8 = (data->req).writebytecountp;
    if (pcVar8 != (curl_off_t *)0x0) {
      *pcVar8 = (data->req).writebytecount;
    }
  }
  iVar14 = Curl_pgrsUpdate(conn);
  comeback = (_Bool *)0x2a;
  if (iVar14 == 0) {
    CVar11 = Curl_speedcheck(data,(data->req).now);
    comeback = (_Bool *)(ulong)CVar11;
  }
  if ((int)comeback != 0) goto LAB_00508b61;
  if ((data->req).keepon == 0) {
    if ((data->set).opt_no_body == false) {
      lVar15 = (data->req).size;
      if ((((lVar15 == -1) || (lVar28 = (data->req).bytecount, lVar15 == lVar28)) ||
          (lVar28 == lVar15 + (data->state).crlf_conversions)) ||
         ((data->req).newurl != (char *)0x0)) {
        if (((data->req).chunk != true) || ((conn->chunk).state == CHUNK_STOP)) goto LAB_00508b24;
        Curl_failf(data,"transfer closed with outstanding read data remaining");
      }
      else {
        Curl_failf(data,"transfer closed with %ld bytes remaining to read");
      }
      comeback = (_Bool *)0x12;
      goto LAB_00508b61;
    }
LAB_00508b24:
    iVar14 = Curl_pgrsUpdate(conn);
    comeback = (_Bool *)0x2a;
    if (iVar14 != 0) goto LAB_00508b61;
  }
  else {
    tVar19 = Curl_timeleft(data,&(data->req).now,false);
    if (tVar19 < 0) {
      lVar15 = (data->req).size;
      tVar19 = curlx_tvdiff((data->req).now,(data->progress).t_startsingle);
      cVar9 = (data->req).bytecount;
      if (lVar15 == -1) {
        Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",tVar19,
                   cVar9);
      }
      else {
        Curl_failf(data,
                   "Operation timed out after %ld milliseconds with %ld out of %ld bytes received",
                   tVar19,cVar9,(data->req).size);
      }
      comeback = (_Bool *)0x1c;
      goto LAB_00508b61;
    }
  }
  *done = ((data->req).keepon & 0x33) == 0;
  comeback = (_Bool *)0x0;
LAB_00508b61:
  return (CURLcode)comeback;
}

Assistant:

CURLcode Curl_readwrite(struct connectdata *conn,
                        struct Curl_easy *data,
                        bool *done,
                        bool *comeback)
{
  struct SingleRequest *k = &data->req;
  CURLcode result;
  int didwhat=0;

  curl_socket_t fd_read;
  curl_socket_t fd_write;
  int select_res = conn->cselect_bits;

  conn->cselect_bits = 0;

  /* only use the proper socket if the *_HOLD bit is not set simultaneously as
     then we are in rate limiting state in that transfer direction */

  if((k->keepon & KEEP_RECVBITS) == KEEP_RECV)
    fd_read = conn->sockfd;
  else
    fd_read = CURL_SOCKET_BAD;

  if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
    fd_write = conn->writesockfd;
  else
    fd_write = CURL_SOCKET_BAD;

  if(conn->data->state.drain) {
    select_res |= CURL_CSELECT_IN;
    DEBUGF(infof(data, "Curl_readwrite: forcibly told to drain data\n"));
  }

  if(!select_res) /* Call for select()/poll() only, if read/write/error
                     status is not known. */
    select_res = Curl_socket_check(fd_read, CURL_SOCKET_BAD, fd_write, 0);

  if(select_res == CURL_CSELECT_ERR) {
    failf(data, "select/poll returned error");
    return CURLE_SEND_ERROR;
  }

  /* We go ahead and do a read if we have a readable socket or if
     the stream was rewound (in which case we have data in a
     buffer) */
  if((k->keepon & KEEP_RECV) &&
     ((select_res & CURL_CSELECT_IN) || conn->bits.stream_was_rewound)) {

    result = readwrite_data(data, conn, k, &didwhat, done, comeback);
    if(result || *done)
      return result;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if((k->keepon & KEEP_SEND) && (select_res & CURL_CSELECT_OUT)) {
    /* write */

    result = readwrite_upload(data, conn, &didwhat);
    if(result)
      return result;
  }

  k->now = Curl_tvnow();
  if(didwhat) {
    /* Update read/write counters */
    if(k->bytecountp)
      *k->bytecountp = k->bytecount; /* read count */
    if(k->writebytecountp)
      *k->writebytecountp = k->writebytecount; /* write count */
  }
  else {
    /* no read no write, this is a timeout? */
    if(k->exp100 == EXP100_AWAITING_CONTINUE) {
      /* This should allow some time for the header to arrive, but only a
         very short time as otherwise it'll be too much wasted time too
         often. */

      /* Quoting RFC2616, section "8.2.3 Use of the 100 (Continue) Status":

         Therefore, when a client sends this header field to an origin server
         (possibly via a proxy) from which it has never seen a 100 (Continue)
         status, the client SHOULD NOT wait for an indefinite period before
         sending the request body.

      */

      time_t ms = Curl_tvdiff(k->now, k->start100);
      if(ms >= data->set.expect_100_timeout) {
        /* we've waited long enough, continue anyway */
        k->exp100 = EXP100_SEND_DATA;
        k->keepon |= KEEP_SEND;
        Curl_expire_done(data, EXPIRE_100_TIMEOUT);
        infof(data, "Done waiting for 100-continue\n");
      }
    }
  }

  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, k->now);
  if(result)
    return result;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, &k->now, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount,
              k->size);
      }
      else {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */

    if(!(data->set.opt_no_body) && (k->size != -1) &&
       (k->bytecount != k->size) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs,
          so we'll check to see if the discrepancy can be explained
          by the number of CRLFs we've changed to LFs.
       */
       (k->bytecount != (k->size + data->state.crlf_conversions)) &&
#endif /* CURL_DO_LINEEND_CONV */
       !k->newurl) {
      failf(data, "transfer closed with %" CURL_FORMAT_CURL_OFF_T
            " bytes remaining to read", k->size - k->bytecount);
      return CURLE_PARTIAL_FILE;
    }
    if(!(data->set.opt_no_body) && k->chunk &&
       (conn->chunk.state != CHUNK_STOP)) {
      /*
       * In chunked mode, return an error if the connection is closed prior to
       * the empty (terminating) chunk is read.
       *
       * The condition above used to check for
       * conn->proto.http->chunk.datasize != 0 which is true after reading
       * *any* chunk, not just the empty chunk.
       *
       */
      failf(data, "transfer closed with outstanding read data remaining");
      return CURLE_PARTIAL_FILE;
    }
    if(Curl_pgrsUpdate(conn))
      return CURLE_ABORTED_BY_CALLBACK;
  }

  /* Now update the "done" boolean we return */
  *done = (0 == (k->keepon&(KEEP_RECV|KEEP_SEND|
                            KEEP_RECV_PAUSE|KEEP_SEND_PAUSE))) ? TRUE : FALSE;

  return CURLE_OK;
}